

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

string * __thiscall
leveldb::Harness::PickRandomKey
          (string *__return_storage_ptr__,Harness *this,Random *rnd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  char cVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pcVar4;
  Comparator *pCVar5;
  size_type sVar6;
  uint uVar7;
  ulong uVar8;
  Comparator *pCVar9;
  uint uVar10;
  int iVar11;
  string rev;
  undefined1 local_70 [32];
  string local_50;
  
  pbVar2 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"foo","");
  }
  else {
    uVar8 = (ulong)rnd->seed_ * 0x41a7;
    uVar10 = (int)(uVar8 >> 0x1f) + ((uint)uVar8 & 0x7fffffff);
    uVar7 = uVar10 + 0x80000001;
    if (-1 < (int)uVar10) {
      uVar7 = uVar10;
    }
    rnd->seed_ = uVar7;
    iVar11 = (int)((ulong)uVar7 % ((ulong)((long)pbVar3 - (long)pbVar2) >> 5 & 0xffffffff));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = pbVar2[iVar11]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + pbVar2[iVar11]._M_string_length);
    uVar8 = (ulong)rnd->seed_ * 0x41a7;
    uVar10 = (int)(uVar8 >> 0x1f) + ((uint)uVar8 & 0x7fffffff);
    uVar7 = uVar10 + 0x80000001;
    if (-1 < (int)uVar10) {
      uVar7 = uVar10;
    }
    rnd->seed_ = uVar7;
    if (uVar7 % 3 == 1) {
      sVar6 = __return_storage_ptr__->_M_string_length;
      if (sVar6 != 0) {
        pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
        cVar1 = pcVar4[sVar6 - 1];
        if ('\0' < cVar1) {
          pcVar4[sVar6 - 1] = cVar1 + -1;
        }
      }
    }
    else if (uVar7 % 3 == 2) {
      pCVar5 = (this->options_).comparator;
      pCVar9 = BytewiseComparator();
      if (pCVar9 == pCVar5) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (pCVar5 != (Comparator *)&reverse_key_comparator) {
          __assert_fail("cmp == &reverse_key_comparator",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
                        ,0x46,"void leveldb::Increment(const Comparator *, std::string *)");
        }
        Reverse_abi_cxx11_((string *)local_70,(leveldb *)(__return_storage_ptr__->_M_dataplus)._M_p,
                           (Slice *)__return_storage_ptr__->_M_string_length);
        std::__cxx11::string::push_back((char)local_70);
        Reverse_abi_cxx11_(&local_50,(leveldb *)local_70._0_8_,(Slice *)local_70._8_8_);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((leveldb *)local_70._0_8_ != (leveldb *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PickRandomKey(Random* rnd, const std::vector<std::string>& keys) {
    if (keys.empty()) {
      return "foo";
    } else {
      const int index = rnd->Uniform(keys.size());
      std::string result = keys[index];
      switch (rnd->Uniform(3)) {
        case 0:
          // Return an existing key
          break;
        case 1: {
          // Attempt to return something smaller than an existing key
          if (!result.empty() && result[result.size() - 1] > '\0') {
            result[result.size() - 1]--;
          }
          break;
        }
        case 2: {
          // Return something larger than an existing key
          Increment(options_.comparator, &result);
          break;
        }
      }
      return result;
    }
  }